

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryToParseExpressionIgnoringErrors(StructuralParser *this)

{
  function<void_()> local_28;
  
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
  local_28._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Parser.h:1176:27)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Parser.h:1176:27)>
       ::_M_manager;
  local_28.super__Function_base._M_functor._8_8_ = this;
  catchParseErrors(&local_28);
  std::_Function_base::~_Function_base(&local_28.super__Function_base);
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryToParseExpressionIgnoringErrors()
    {
        pool_ptr<AST::Expression> result;
        catchParseErrors ([this, &result] { result = parseExpression(); });
        return result;
    }